

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageNextXrGetSpaceRoomLayoutFB
                   (XrSession session,XrSpace space,XrRoomLayoutFB *roomLayoutOutput)

{
  XrResult XVar1;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar2;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  GenValidUsageXrHandleInfo *gen_session_info;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> info_with_instance;
  XrResult result;
  XrRoomLayoutFB *roomLayoutOutput_local;
  XrSpace space_local;
  XrSession session_local;
  
  pVar2 = HandleInfo<XrSession_T_*>::getWithInstanceInfo(&g_session_info,session);
  XVar1 = (*(pVar2.second)->dispatch_table->GetSpaceRoomLayoutFB)(session,space,roomLayoutOutput);
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL GenValidUsageNextXrGetSpaceRoomLayoutFB(
    XrSession session,
    XrSpace space,
    XrRoomLayoutFB* roomLayoutOutput) {
    XrResult result = XR_SUCCESS;
    try {
        auto info_with_instance = g_session_info.getWithInstanceInfo(session);
        GenValidUsageXrHandleInfo *gen_session_info = info_with_instance.first;
        (void)gen_session_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        result = gen_instance_info->dispatch_table->GetSpaceRoomLayoutFB(session, space, roomLayoutOutput);
    } catch (...) {
        result = XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}